

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O0

void __thiscall w3Stack::AssertTopIsValue(w3Stack *this)

{
  size_t sVar1;
  w3StackValue *pwVar2;
  string local_68;
  byte local_31;
  string local_30;
  w3Stack *local_10;
  w3Stack *this_local;
  
  local_10 = this;
  sVar1 = size(this);
  if ((sVar1 == 0) || (pwVar2 = top(this), pwVar2->tag != Tag_Value)) {
    DumpStack(this,"AssertTopIsValue");
  }
  sVar1 = size(this);
  local_31 = 0;
  if (sVar1 == 0) {
    sVar1 = size(this);
    StringFormat_abi_cxx11_(&local_30,"%lX",sVar1);
    local_31 = 1;
    AssertFailedFormat("size () >= 1",&local_30);
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_30);
  }
  pwVar2 = top(this);
  if (pwVar2->tag != Tag_Value) {
    pwVar2 = top(this);
    StringFormat_abi_cxx11_(&local_68,"%X %X",(ulong)pwVar2->tag,0x80);
    AssertFailedFormat("top ().tag == Tag_Value",&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void AssertTopIsValue ()
    {
        if (size () < 1 || top ().tag != Tag_Value)
            DumpStack ("AssertTopIsValue");
        AssertFormat (size () >= 1, ("%" FORMAT_SIZE "X", size ()));
        AssertFormat (top ().tag == Tag_Value, ("%X %X", top ().tag, Tag_Value));
    }